

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyweight.cpp
# Opt level: O2

ostream * operator<<(ostream *out,User *usr)

{
  ostream *poVar1;
  string sStack_58;
  string local_38;
  
  poVar1 = std::operator<<(out,"My name is ");
  User::first_name_abi_cxx11_(&local_38,usr);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1," ");
  User::last_name_abi_cxx11_(&sStack_58,usr);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const User& usr)
	{
		return out << "My name is " << usr.first_name() << " " << usr.last_name();
	}